

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool __thiscall CConnman::InitBinds(CConnman *this,Options *options)

{
  pointer pCVar1;
  pointer pNVar2;
  bool bVar3;
  bool bVar4;
  uint16_t uVar5;
  CService *addrBind;
  pointer pNVar6;
  pointer pCVar7;
  long in_FS_OFFSET;
  in_addr inaddr_any;
  in_addr local_8c;
  anon_union_16_3_a3f0114d_for___in6_u local_88;
  uint local_78;
  direct_or_indirect local_58;
  uint local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar7 = (options->vBinds).super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (options->vBinds).super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar7 != pCVar1) {
    bVar4 = false;
    do {
      bVar3 = Bind(this,pCVar7,1,None);
      if (!bVar3) goto LAB_001afffd;
      pCVar7 = pCVar7 + 1;
    } while (pCVar7 != pCVar1);
  }
  pNVar2 = (options->vWhiteBinds).
           super__Vector_base<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pNVar6 = (options->vWhiteBinds).
                super__Vector_base<NetWhitebindPermissions,_std::allocator<NetWhitebindPermissions>_>
                ._M_impl.super__Vector_impl_data._M_start; pNVar6 != pNVar2; pNVar6 = pNVar6 + 1) {
    bVar4 = Bind(this,&pNVar6->m_service,1,(pNVar6->super_NetPermissions).m_flags);
    if (!bVar4) goto LAB_001afffb;
  }
  pCVar7 = (options->onion_binds).super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar1 = (options->onion_binds).super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar7 != pCVar1) {
    bVar4 = false;
    do {
      bVar3 = Bind(this,pCVar7,3,None);
      if (!bVar3) goto LAB_001afffd;
      pCVar7 = pCVar7 + 1;
    } while (pCVar7 != pCVar1);
  }
  if (options->bind_on_any == true) {
    local_88._0_8_ = (void *)0x0;
    local_88._8_8_ = 0;
    uVar5 = GetListenPort();
    CService::CService((CService *)&local_58.indirect_contents,(in6_addr *)&local_88,uVar5);
    Bind(this,(CService *)&local_58.indirect_contents,0,None);
    local_8c.s_addr = 0;
    uVar5 = GetListenPort();
    CService::CService((CService *)&local_88,&local_8c,uVar5);
    bVar4 = Bind(this,(CService *)&local_88,1,None);
    if (0x10 < local_78) {
      free((void *)local_88._0_8_);
    }
    if (0x10 < local_48) {
      free(local_58.indirect_contents.indirect);
    }
    if (!bVar4) {
LAB_001afffb:
      bVar4 = false;
      goto LAB_001afffd;
    }
  }
  bVar4 = true;
LAB_001afffd:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::InitBinds(const Options& options)
{
    for (const auto& addrBind : options.vBinds) {
        if (!Bind(addrBind, BF_REPORT_ERROR, NetPermissionFlags::None)) {
            return false;
        }
    }
    for (const auto& addrBind : options.vWhiteBinds) {
        if (!Bind(addrBind.m_service, BF_REPORT_ERROR, addrBind.m_flags)) {
            return false;
        }
    }
    for (const auto& addr_bind : options.onion_binds) {
        if (!Bind(addr_bind, BF_REPORT_ERROR | BF_DONT_ADVERTISE, NetPermissionFlags::None)) {
            return false;
        }
    }
    if (options.bind_on_any) {
        // Don't consider errors to bind on IPv6 "::" fatal because the host OS
        // may not have IPv6 support and the user did not explicitly ask us to
        // bind on that.
        const CService ipv6_any{in6_addr(IN6ADDR_ANY_INIT), GetListenPort()}; // ::
        Bind(ipv6_any, BF_NONE, NetPermissionFlags::None);

        struct in_addr inaddr_any;
        inaddr_any.s_addr = htonl(INADDR_ANY);
        const CService ipv4_any{inaddr_any, GetListenPort()}; // 0.0.0.0
        if (!Bind(ipv4_any, BF_REPORT_ERROR, NetPermissionFlags::None)) {
            return false;
        }
    }
    return true;
}